

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_dist_wtd_convolve_2d_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  short *psVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  short *psVar14;
  int iVar15;
  uint uVar16;
  uint8_t uVar17;
  ulong uVar18;
  long lVar19;
  int local_8ba0;
  ulong local_8b98;
  ulong local_8b90;
  short *local_8b80;
  uint local_8b68;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  uVar11 = (h + (uint)uVar1) - 1;
  iVar9 = (uVar1 >> 1) - 1;
  lVar19 = (long)w;
  bVar6 = (byte)conv_params->round_0;
  if (0 < (int)uVar11) {
    uVar2 = filter_params_x->taps;
    piVar3 = filter_params_x->filter_ptr;
    local_8ba0 = 1 - (uint)(uVar2 >> 1);
    local_8b90 = 0;
    do {
      if (0 < w) {
        uVar18 = 0;
        iVar13 = local_8ba0;
        do {
          if (uVar2 == 0) {
            iVar15 = 0x4000;
          }
          else {
            iVar15 = 0x4000;
            uVar12 = 0;
            do {
              iVar15 = iVar15 + (uint)src[uVar12 + ((long)iVar13 - (long)(iVar9 * src_stride))] *
                                (int)*(short *)((long)piVar3 +
                                               uVar12 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar12 = uVar12 + 1;
            } while ((uint)uVar2 != uVar12);
          }
          asStack_8b38[uVar18 + local_8b90 * lVar19] =
               (short)(iVar15 + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
          uVar18 = uVar18 + 1;
          iVar13 = iVar13 + 1;
        } while (uVar18 != (uint)w);
      }
      local_8b90 = local_8b90 + 1;
      local_8ba0 = local_8ba0 + src_stride;
    } while (local_8b90 != uVar11);
  }
  local_8b68 = (uint)uVar1;
  if (0 < h) {
    bVar7 = 0xe - ((char)conv_params->round_1 + bVar6);
    pCVar4 = conv_params->dst;
    iVar13 = conv_params->dst_stride;
    piVar3 = filter_params_y->filter_ptr;
    iVar15 = 1 << (0x16 - bVar6 & 0x1f);
    local_8b80 = asStack_8b38 + (1 - (ulong)(uint)(uVar1 >> 1)) * lVar19 + (long)(iVar9 * w);
    local_8b98 = 0;
    do {
      if (0 < w) {
        lVar5 = local_8b98 * (long)iVar13;
        uVar18 = 0;
        psVar14 = local_8b80;
        do {
          iVar9 = iVar15;
          if ((ulong)filter_params_y->taps != 0) {
            uVar12 = 0;
            psVar10 = psVar14;
            do {
              iVar9 = iVar9 + (int)*psVar10 *
                              (int)*(short *)((long)piVar3 +
                                             uVar12 * 2 +
                                             (ulong)((subpel_y_qn & 0xfU) * local_8b68 * 2));
              uVar12 = uVar12 + 1;
              psVar10 = psVar10 + lVar19;
            } while (filter_params_y->taps != uVar12);
          }
          bVar8 = (byte)conv_params->round_1;
          uVar11 = ((1 << (bVar8 & 0x1f)) >> 1) + iVar9 >> (bVar8 & 0x1f);
          if (conv_params->do_average == 0) {
            pCVar4[lVar5 + uVar18] = (CONV_BUF_TYPE)uVar11;
          }
          else {
            uVar16 = (uint)pCVar4[lVar5 + uVar18];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar11 = (uVar11 & 0xffff) + uVar16 >> 1;
            }
            else {
              uVar11 = (int)((uVar11 & 0xffff) * conv_params->bck_offset +
                            uVar16 * conv_params->fwd_offset) >> 4;
            }
            bVar8 = (0x16 - bVar6) - bVar8;
            iVar9 = (int)((-1 << (bVar8 - 1 & 0x1f)) +
                          (-1 << (bVar8 & 0x1f)) + ((1 << (bVar7 & 0x1f)) >> 1) + uVar11) >>
                    (bVar7 & 0x1f);
            if (iVar9 < 1) {
              iVar9 = 0;
            }
            uVar17 = (uint8_t)iVar9;
            if (0xfe < iVar9) {
              uVar17 = 0xff;
            }
            dst[uVar18 + local_8b98 * (long)dst_stride] = uVar17;
          }
          uVar18 = uVar18 + 1;
          psVar14 = psVar14 + 1;
        } while (uVar18 != (uint)w);
      }
      local_8b98 = local_8b98 + 1;
      local_8b80 = local_8b80 + lVar19;
    } while (local_8b98 != (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_c(const uint8_t *src, int src_stride,
                                uint8_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_x,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_x_qn, const int subpel_y_qn,
                                ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}